

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_message_field.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::objectivec::MessageFieldGenerator::WantsHasProperty
          (MessageFieldGenerator *this)

{
  OneofDescriptor *pOVar1;
  long in_RDI;
  
  pOVar1 = FieldDescriptor::containing_oneof(*(FieldDescriptor **)(in_RDI + 8));
  return pOVar1 == (OneofDescriptor *)0x0;
}

Assistant:

bool MessageFieldGenerator::WantsHasProperty(void) const {
  if (descriptor_->containing_oneof() != NULL) {
    // If in a oneof, it uses the oneofcase instead of a has bit.
    return false;
  }
  // In both proto2 & proto3, message fields have a has* property to tell
  // when it is a non default value.
  return true;
}